

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeWindow(ImGuiWindow *window,char *label)

{
  uint uVar1;
  bool bVar2;
  ImDrawList *this;
  char *pcVar3;
  ImGuiColumns *columns;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  ImVec2 *lhs;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *local_88;
  uint local_80;
  byte local_45;
  int local_44;
  int n;
  ImGuiWindowFlags flags;
  byte local_31;
  char *pcStack_30;
  bool open;
  char *label_local;
  ImGuiWindow *window_local;
  
  pcStack_30 = label;
  label_local = (char *)window;
  if (window == (ImGuiWindow *)0x0) {
    BulletText("%s: NULL",label);
  }
  else {
    local_45 = 1;
    if ((window->Active & 1U) == 0) {
      local_45 = window->WasActive;
    }
    local_31 = TreeNode(label,"%s \'%s\', %d @ 0x%p",label,window->Name,(ulong)(local_45 & 1),window
                       );
    bVar2 = IsItemHovered(0);
    if ((bVar2) && ((label_local[0x7f] & 1U) != 0)) {
      this = GetForegroundDrawList();
      lhs = (ImVec2 *)(label_local + 0x10);
      _n = operator+(lhs,(ImVec2 *)(label_local + 0x18));
      ImDrawList::AddRect(this,lhs,(ImVec2 *)&n,0xff00ffff,0.0,0xf,1.0);
    }
    if ((local_31 & 1) != 0) {
      if ((label_local[0x7f] & 1U) == 0) {
        TextDisabled("Note: window is not currently visible.");
      }
      if ((label_local[0x3b0] & 1U) != 0) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar1 = *(uint *)(label_local + 0xc);
      NodeDrawList((ImGuiWindow *)label_local,*(ImDrawList **)(label_local + 0x2b0),"DrawList");
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)",
                 (double)*(float *)(label_local + 0x10),(double)*(float *)(label_local + 0x14),
                 (double)*(float *)(label_local + 0x18),(double)*(float *)(label_local + 0x1c),
                 (double)*(float *)(label_local + 0x28),(double)*(float *)(label_local + 0x2c));
      pcVar5 = "";
      if ((uVar1 & 0x1000000) != 0) {
        pcVar5 = "Child ";
      }
      pcVar4 = "";
      if ((uVar1 & 0x2000000) != 0) {
        pcVar4 = "Tooltip ";
      }
      pcVar7 = "";
      if ((uVar1 & 0x4000000) != 0) {
        pcVar7 = "Popup ";
      }
      pcVar8 = "";
      if ((uVar1 & 0x8000000) != 0) {
        pcVar8 = "Modal ";
      }
      pcVar11 = "";
      if ((uVar1 & 0x10000000) != 0) {
        pcVar11 = "ChildMenu ";
      }
      pcVar6 = "";
      if ((uVar1 & 0x100) != 0) {
        pcVar6 = "NoSavedSettings ";
      }
      pcVar10 = "";
      if ((uVar1 & 0x200) != 0) {
        pcVar10 = "NoMouseInputs";
      }
      pcVar9 = "";
      if ((uVar1 & 0x40000) != 0) {
        pcVar9 = "NoNavInputs";
      }
      pcVar3 = "";
      if ((uVar1 & 0x40) != 0) {
        pcVar3 = "AlwaysAutoResize";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar1,pcVar5,pcVar4,pcVar7,pcVar8,
                 pcVar11,pcVar6,pcVar10,pcVar9,pcVar3);
      pcVar5 = "";
      if ((label_local[0x7c] & 1U) != 0) {
        pcVar5 = "X";
      }
      pcVar4 = "";
      if ((label_local[0x7d] & 1U) != 0) {
        pcVar4 = "Y";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",
                 (double)*(float *)(label_local + 0x54),(double)*(float *)(label_local + 0x5c),
                 (double)*(float *)(label_local + 0x58),(double)*(float *)(label_local + 0x60),
                 pcVar5,pcVar4);
      if (((label_local[0x7e] & 1U) == 0) && ((label_local[0x7f] & 1U) == 0)) {
        local_80 = 0xffffffff;
      }
      else {
        local_80 = (uint)*(short *)(label_local + 0x8e);
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)(label_local[0x7e] & 1),(ulong)(label_local[0x7f] & 1),
                 (ulong)(label_local[0x80] & 1),(ulong)local_80);
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)(label_local[0x84] & 1),(ulong)(label_local[0x85] & 1),
                 (ulong)*(uint *)(label_local + 0x9c),(ulong)*(uint *)(label_local + 0xa0),
                 (ulong)(label_local[0x83] & 1),pcVar11,pcVar6,pcVar10,pcVar9,pcVar3);
      BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X",
                 (ulong)*(uint *)(label_local + 0x388),(ulong)*(uint *)(label_local + 0x38c),
                 (ulong)*(uint *)(label_local + 0x144));
      if (*(long *)(label_local + 0x380) == 0) {
        local_88 = "NULL";
      }
      else {
        local_88 = (char *)**(undefined8 **)(label_local + 0x380);
      }
      BulletText("NavLastChildNavWindow: %s",local_88);
      bVar2 = ImRect::IsInverted((ImRect *)(label_local + 0x390));
      if (bVar2) {
        BulletText("NavRectRel[0]: <None>");
      }
      else {
        BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)",(double)*(float *)(label_local + 0x390),
                   (double)*(float *)(label_local + 0x394),(double)*(float *)(label_local + 0x398),
                   (double)*(float *)(label_local + 0x39c));
      }
      if (*(char **)(label_local + 0x368) != label_local) {
        NodeWindow(*(ImGuiWindow **)(label_local + 0x368),"RootWindow");
      }
      if (*(long *)(label_local + 0x360) != 0) {
        NodeWindow(*(ImGuiWindow **)(label_local + 0x360),"ParentWindow");
      }
      if (0 < *(int *)(label_local + 0x188)) {
        NodeWindows((ImVector<ImGuiWindow_*> *)(label_local + 0x188),"ChildWindows");
      }
      if ((0 < *(int *)(label_local + 0x298)) &&
         (bVar2 = TreeNode("Columns","Columns sets (%d)",(ulong)*(uint *)(label_local + 0x298)),
         bVar2)) {
        for (local_44 = 0; local_44 < *(int *)(label_local + 0x298); local_44 = local_44 + 1) {
          columns = ImVector<ImGuiColumns>::operator[]
                              ((ImVector<ImGuiColumns> *)(label_local + 0x298),local_44);
          NodeColumns(columns);
        }
        TreePop();
      }
      NodeStorage((ImGuiStorage *)(label_local + 0x288),"Storage");
      TreePop();
    }
  }
  return;
}

Assistant:

static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (window == NULL)
            {
                ImGui::BulletText("%s: NULL", label);
                return;
            }
            bool open = ImGui::TreeNode(label, "%s '%s', %d @ 0x%p", label, window->Name, (window->Active || window->WasActive), window);
            if (ImGui::IsItemHovered() && window->WasActive)
                ImGui::GetForegroundDrawList()->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!open)
                return;

            if (!window->WasActive)
                ImGui::TextDisabled("Note: window is not currently visible.");
            if (window->MemoryCompacted)
                ImGui::TextDisabled("Note: some memory buffers have been compacted/freed.");

            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                    NodeColumns(&window->ColumnsStorage[n]);
                ImGui::TreePop();
            }
            NodeStorage(&window->StateStorage, "Storage");
            ImGui::TreePop();
        }